

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplicialCholesky.h
# Opt level: O1

void __thiscall
Eigen::
SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
::compute<true>(SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
                *this,MatrixType *matrix)

{
  ConstCholMatrixPtr pmat;
  CholMatrixType tmp;
  CholMatrixType *local_60;
  SparseMatrix<double,_0,_int> local_58;
  
  local_58.super_SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>.
  super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>.m_isRValue =
       (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>)false;
  local_58.m_outerSize = 0;
  local_58.m_innerSize = 0;
  local_58.m_outerIndex = (StorageIndex *)0x0;
  local_58.m_innerNonZeros = (StorageIndex *)0x0;
  local_58.m_data.m_values = (Scalar *)0x0;
  local_58.m_data.m_indices = (StorageIndex *)0x0;
  local_58.m_data.m_size = 0;
  local_58.m_data.m_allocatedSize = 0;
  SparseMatrix<double,_0,_int>::resize(&local_58,matrix->m_outerSize,matrix->m_outerSize);
  ordering(this,matrix,&local_60,&local_58);
  analyzePattern_preordered(this,local_60,true);
  factorize_preordered<true>(this,local_60);
  free(local_58.m_outerIndex);
  free(local_58.m_innerNonZeros);
  internal::CompressedStorage<double,_int>::~CompressedStorage(&local_58.m_data);
  return;
}

Assistant:

void compute(const MatrixType& matrix)
    {
      eigen_assert(matrix.rows()==matrix.cols());
      Index size = matrix.cols();
      CholMatrixType tmp(size,size);
      ConstCholMatrixPtr pmat;
      ordering(matrix, pmat, tmp);
      analyzePattern_preordered(*pmat, DoLDLT);
      factorize_preordered<DoLDLT>(*pmat);
    }